

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.h
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(ConfidentialTxOutReference *this)

{
  ConfidentialTxOutReference *in_RDI;
  
  ~ConfidentialTxOutReference(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~ConfidentialTxOutReference() {
    // do nothing
  }